

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

ptTy Bezier(double t,ptTy *p0,ptTy *p1,ptTy *p2,double *pAngle)

{
  ptTy pt;
  ptTy pt_00;
  ptTy pt_01;
  ptTy pt_02;
  double *in_RCX;
  double in_XMM0_Qa;
  double dVar1;
  ptTy pVar2;
  ptTy dtB;
  double oneMt;
  ptTy *in_stack_fffffffffffffee8;
  ptTy *in_stack_fffffffffffffef0;
  
  if (in_RCX != (double *)0x0) {
    in_stack_fffffffffffffee8 = (ptTy *)((1.0 - in_XMM0_Qa) * 2.0);
    ptTy::operator-(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    pVar2.y = (double)in_stack_fffffffffffffef0;
    pVar2.x = (double)in_stack_fffffffffffffee8;
    operator*(6.11047051004016e-318,pVar2);
    in_stack_fffffffffffffef0 = (ptTy *)(in_XMM0_Qa * 2.0);
    ptTy::operator-(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    pt.y = (double)in_stack_fffffffffffffef0;
    pt.x = (double)in_stack_fffffffffffffee8;
    operator*(6.1110238635635e-318,pt);
    pVar2 = ptTy::operator+(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    dVar1 = atan2(pVar2.x,pVar2.y);
    dVar1 = rad2deg360(dVar1);
    *in_RCX = dVar1;
  }
  pt_00.y = (double)in_stack_fffffffffffffef0;
  pt_00.x = (double)in_stack_fffffffffffffee8;
  operator*(6.11173037743706e-318,pt_00);
  pt_01.y = (double)in_stack_fffffffffffffef0;
  pt_01.x = (double)in_stack_fffffffffffffee8;
  operator*(6.1120811640456e-318,pt_01);
  ptTy::operator+(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pt_02.y = (double)in_stack_fffffffffffffef0;
  pt_02.x = (double)in_stack_fffffffffffffee8;
  operator*(6.11251594181394e-318,pt_02);
  pVar2 = ptTy::operator+(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  return pVar2;
}

Assistant:

ptTy Bezier (double t, const ptTy& p0, const ptTy& p1, const ptTy& p2,
             double* pAngle)
{
    const double oneMt  = 1-t;
    
    // Angle wanted?
    if (pAngle) {
        // B'(t) = 2(1-t)(p1-p0)+2t(p2-p1)
        ptTy dtB = 2 * oneMt * (p1-p0) + 2 * t * (p2-p1);
        *pAngle = rad2deg360(std::atan2(dtB.x, dtB.y));
    }
    
    // We calculate the value directly, ie. without De-Casteljau
    // B(t) = (1-t)^2 p0 + 2(1+t)t p1 + t^2 p2
    return
    (oneMt*oneMt)   * p0 +              // (1-t)^2 p0 +
    (2 * oneMt * t) * p1 +              // 2(1+t)t p1 +
    (t*t)           * p2;               // t^2     p2
}